

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O0

void i2cp_state_init(i2cp_state *st,i2cp_write_handler h,void *impl)

{
  long in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  
  if (in_RDI == (undefined1 *)0x0) {
    __assert_fail("st",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/i2cp.c"
                  ,0xc0,"void i2cp_state_init(struct i2cp_state *, i2cp_write_handler, void *)");
  }
  if (in_RSI != 0) {
    if (in_RDX != 0) {
      *(long *)(in_RDI + 0x1010) = in_RSI;
      *(undefined2 *)(in_RDI + 2) = 0;
      *in_RDI = 0;
      *(long *)(in_RDI + 8) = in_RDX;
      *(undefined4 *)(in_RDI + 0x1018) = 0;
      memset(in_RDI + 0x101c,0,0x10000);
      i2cp_ringbuf_init((i2cp_ringbuf *)(in_RDI + 0x1101c));
      i2cp_ringbuf_init((i2cp_ringbuf *)(in_RDI + 0x2110a0));
      memset(in_RDI + 0x10,0,0x1000);
      return;
    }
    __assert_fail("impl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/i2cp.c"
                  ,0xc2,"void i2cp_state_init(struct i2cp_state *, i2cp_write_handler, void *)");
  }
  __assert_fail("h",
                "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/i2cp.c"
                ,0xc1,"void i2cp_state_init(struct i2cp_state *, i2cp_write_handler, void *)");
}

Assistant:

void i2cp_state_init(struct i2cp_state * st, i2cp_write_handler h, void * impl)
{
  assert(st);
  assert(h);
  assert(impl);
  st->write = h;
  st->sid = 0;
  st->sentinit = false;
  st->writeimpl = impl;
  st->readcur.sz = 0;
  memset(st->readcur.buf, 0, sizeof(st->readcur.buf));
  i2cp_ringbuf_init(&st->readbuf);
  i2cp_ringbuf_init(&st->writebuf);
  memset(st->handlers, 0, sizeof(st->handlers));
}